

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cpp
# Opt level: O2

Sexp * AnalyzeShortCircuit(Sexp *form)

{
  Sexp *pSVar1;
  Meaning *pMVar2;
  JetRuntimeException *this;
  bool expr;
  _Vector_base<Sexp_*,_std::allocator<Sexp_*>_> local_d8;
  _Vector_base<Sexp_*,_std::allocator<Sexp_*>_> local_b8;
  string local_98;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  undefined1 local_58 [24];
  vector<Sexp_*,_std::allocator<Sexp_*>_> args;
  ContractFrameProtector __contract_frame;
  FrameProtector __frame_prot;
  Sexp *form_local;
  
  __frame_prot.protected_frame = (Frame *)form;
  ContractFrameProtector::ContractFrameProtector
            ((ContractFrameProtector *)
             &args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,"AnalyzeShortCircuit");
  ContractFrame::CheckPrecondition
            ((ContractFrame *)
             args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,form->kind == CONS,"form->IsCons()");
  pSVar1 = Sexp::Car(form);
  ContractFrame::CheckPrecondition
            ((ContractFrame *)
             args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,pSVar1->kind == SYMBOL,
             "form->Car()->IsSymbol()");
  pSVar1 = Sexp::Car((Sexp *)__frame_prot.protected_frame);
  expr = true;
  if ((pSVar1->field_1).cons.car != (Sexp *)0xc) {
    pSVar1 = Sexp::Car((Sexp *)__frame_prot.protected_frame);
    expr = (pSVar1->field_1).cons.car == (Sexp *)0xd;
  }
  ContractFrame::CheckPrecondition
            ((ContractFrame *)
             args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,expr,
             "form->Car()->symbol_value == SymbolInterner::And || form->Car()->symbol_value == SymbolInterner::Or"
            );
  FrameProtector::FrameProtector((FrameProtector *)&__contract_frame,"AnalyzeShortCircuit");
  FrameProtector::ProtectValue((FrameProtector *)&__contract_frame,(Sexp **)&__frame_prot,"form");
  local_58._16_8_ = (Sexp *)0x0;
  args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  FrameProtector::ProtectVector
            ((FrameProtector *)&__contract_frame,
             (vector<Sexp_*,_std::allocator<Sexp_*>_> *)(local_58 + 0x10),"args");
  Sexp::Length((Sexp *)local_58);
  if ((jet_bool)local_58[8] != false) {
    pSVar1 = Sexp::Cdr((Sexp *)__frame_prot.protected_frame);
    local_78._8_8_ = 0;
    local_60 = std::
               _Function_handler<void_(Sexp_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/analysis.cpp:623:7)>
               ::_M_invoke;
    local_68 = std::
               _Function_handler<void_(Sexp_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/analysis.cpp:623:7)>
               ::_M_manager;
    local_78._M_unused._M_object = (vector<Sexp_*,_std::allocator<Sexp_*>_> *)(local_58 + 0x10);
    Sexp::ForEach(pSVar1,(function<void_(Sexp_*)> *)&local_78);
    std::_Function_base::~_Function_base((_Function_base *)&local_78);
    pSVar1 = Sexp::Car((Sexp *)__frame_prot.protected_frame);
    if ((pSVar1->field_1).cons.car == (Sexp *)0xc) {
      pMVar2 = (Meaning *)operator_new(0x20);
      std::vector<Sexp_*,_std::allocator<Sexp_*>_>::vector
                ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)&local_d8,
                 (vector<Sexp_*,_std::allocator<Sexp_*>_> *)(local_58 + 0x10));
      pMVar2->_vptr_Meaning = (_func_int **)&PTR_Eval_00129bc8;
      pMVar2[1]._vptr_Meaning = (_func_int **)local_d8._M_impl.super__Vector_impl_data._M_start;
      pMVar2[2]._vptr_Meaning = (_func_int **)local_d8._M_impl.super__Vector_impl_data._M_finish;
      pMVar2[3]._vptr_Meaning =
           (_func_int **)local_d8._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::_Vector_base<Sexp_*,_std::allocator<Sexp_*>_>::~_Vector_base(&local_d8);
      FrameProtector::ProtectVector
                ((FrameProtector *)&__contract_frame,
                 (vector<Sexp_*,_std::allocator<Sexp_*>_> *)(pMVar2 + 1),"meaning->Arguments()");
      pSVar1 = GcHeap::AllocateMeaning(pMVar2);
    }
    else {
      pSVar1 = Sexp::Car((Sexp *)__frame_prot.protected_frame);
      if ((pSVar1->field_1).cons.car != (Sexp *)0xd) {
        __assert_fail("form->Car()->symbol_value == SymbolInterner::Or",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/analysis.cpp"
                      ,0x276,"Sexp *AnalyzeShortCircuit(Sexp *)");
      }
      pMVar2 = (Meaning *)operator_new(0x20);
      std::vector<Sexp_*,_std::allocator<Sexp_*>_>::vector
                ((vector<Sexp_*,_std::allocator<Sexp_*>_> *)&local_b8,
                 (vector<Sexp_*,_std::allocator<Sexp_*>_> *)(local_58 + 0x10));
      pMVar2->_vptr_Meaning = (_func_int **)&PTR_Eval_00129c18;
      pMVar2[1]._vptr_Meaning = (_func_int **)local_b8._M_impl.super__Vector_impl_data._M_start;
      pMVar2[2]._vptr_Meaning = (_func_int **)local_b8._M_impl.super__Vector_impl_data._M_finish;
      pMVar2[3]._vptr_Meaning =
           (_func_int **)local_b8._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::_Vector_base<Sexp_*,_std::allocator<Sexp_*>_>::~_Vector_base(&local_b8);
      FrameProtector::ProtectVector
                ((FrameProtector *)&__contract_frame,
                 (vector<Sexp_*,_std::allocator<Sexp_*>_> *)(pMVar2 + 1),"meaning->Arguments()");
      pSVar1 = GcHeap::AllocateMeaning(pMVar2);
    }
    std::_Vector_base<Sexp_*,_std::allocator<Sexp_*>_>::~_Vector_base
              ((_Vector_base<Sexp_*,_std::allocator<Sexp_*>_> *)(local_58 + 0x10));
    FrameProtector::~FrameProtector((FrameProtector *)&__contract_frame);
    ContractFrameProtector::~ContractFrameProtector
              ((ContractFrameProtector *)
               &args.super__Vector_base<Sexp_*,_std::allocator<Sexp_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    return pSVar1;
  }
  this = (JetRuntimeException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_98,"invalid short-circuiting form",(allocator *)local_58);
  JetRuntimeException::JetRuntimeException(this,&local_98);
  __cxa_throw(this,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
}

Assistant:

Sexp *AnalyzeShortCircuit(Sexp *form) {
  CONTRACT {
    PRECONDITION(form->IsCons());
    PRECONDITION(form->Car()->IsSymbol());
    PRECONDITION(form->Car()->symbol_value == SymbolInterner::And ||
                 form->Car()->symbol_value == SymbolInterner::Or);
  }